

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_3f1a5b::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  string *psVar4;
  long lVar5;
  cmValue __u;
  FILE *__stream;
  unsigned_long uVar6;
  CURL_conflict *data;
  optional<int> oVar7;
  curl_slist *list;
  char *extraout_RDX;
  string *h;
  pointer pbVar8;
  bool bVar9;
  string_view value;
  string_view tls_version_00;
  string_view value_00;
  string_view value_01;
  cURLProgressHelper helper;
  bool local_241;
  string e_13;
  string local_220;
  pointer local_200;
  string log;
  cURLEasyGuard g_curl;
  CURLcode local_1cc;
  cmFileCommandVectorOfChar chunkDebug;
  string *local_1a8;
  char *local_198;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tls_version;
  cmFileCommandVectorOfChar chunkResponse;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string userpwd;
  string logVar;
  string netrc_file;
  string netrc_level;
  string statusVar;
  string url;
  string filename;
  string local_50;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&helper,"UPLOAD must be called with at least three arguments.",
               (allocator<char> *)&tls_version);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&helper);
    return false;
  }
  std::__cxx11::string::string((string *)&filename,(string *)(pbVar8 + 1));
  std::__cxx11::string::string((string *)&url,(string *)(pbVar8 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  tls_version.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pcVar1 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_TLS_VERIFY",(allocator<char> *)&userpwd);
  local_241 = cmMakefile::IsOn(pcVar1,(string *)&helper);
  std::__cxx11::string::~string((string *)&helper);
  pcVar1 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_TLS_CAINFO",(allocator<char> *)&userpwd);
  local_1a8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)&helper);
  std::__cxx11::string::~string((string *)&helper);
  userpwd._M_dataplus._M_p = (pointer)&userpwd.field_2;
  userpwd._M_string_length = 0;
  userpwd.field_2._M_local_buf[0] = '\0';
  pcVar1 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_NETRC",(allocator<char> *)&netrc_file);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&helper);
  std::__cxx11::string::string((string *)&netrc_level,(string *)psVar4);
  std::__cxx11::string::~string((string *)&helper);
  pcVar1 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_NETRC_FILE",(allocator<char> *)&local_220);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&helper);
  std::__cxx11::string::string((string *)&netrc_file,(string *)psVar4);
  std::__cxx11::string::~string((string *)&helper);
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar9 = false;
  local_200 = (pointer)0x0;
  lVar5 = 0;
  for (psVar4 = pbVar8 + 3;
      psVar4 != (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
    bVar2 = std::operator==(psVar4,"TIMEOUT");
    if (bVar2) {
      psVar4 = psVar4 + 1;
      if (psVar4 == (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&helper,"UPLOAD missing time for TIMEOUT.",
                   (allocator<char> *)&local_220);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_001eceae;
      }
      lVar5 = atol((psVar4->_M_dataplus)._M_p);
    }
    else {
      bVar2 = std::operator==(psVar4,"INACTIVITY_TIMEOUT");
      if (bVar2) {
        psVar4 = psVar4 + 1;
        if (psVar4 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator<char> *)&local_220);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001eceae;
        }
        local_200 = (pointer)atol((psVar4->_M_dataplus)._M_p);
      }
      else {
        bVar2 = std::operator==(psVar4,"LOG");
        if (bVar2) {
          if (psVar4 + 1 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&helper,"UPLOAD missing VAR for LOG.",(allocator<char> *)&local_220
                      );
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_001eceae;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
          psVar4 = psVar4 + 1;
        }
        else {
          bVar2 = std::operator==(psVar4,"STATUS");
          if (bVar2) {
            if (psVar4 + 1 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD missing VAR for STATUS.",
                         (allocator<char> *)&local_220);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001eceae;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
            psVar4 = psVar4 + 1;
          }
          else {
            bVar2 = std::operator==(psVar4,"SHOW_PROGRESS");
            if (bVar2) {
              bVar9 = true;
            }
            else {
              bVar2 = std::operator==(psVar4,"TLS_VERSION");
              if (bVar2) {
                psVar4 = psVar4 + 1;
                if (psVar4 == (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&helper,"UPLOAD missing value for TLS_VERSION.",
                             (allocator<char> *)&local_220);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_001eceae;
                }
                std::optional<std::__cxx11::string>::operator=
                          ((optional<std::__cxx11::string> *)&tls_version,psVar4);
              }
              else {
                bVar2 = std::operator==(psVar4,"TLS_VERIFY");
                if (bVar2) {
                  if (psVar4 + 1 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&helper,"UPLOAD missing bool value for TLS_VERIFY.",
                               (allocator<char> *)&local_220);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_001eceae;
                  }
                  value._M_str = extraout_RDX;
                  value._M_len = (size_t)psVar4[1]._M_dataplus._M_p;
                  local_241 = cmValue::IsOn((cmValue *)psVar4[1]._M_string_length,value);
                  psVar4 = psVar4 + 1;
                }
                else {
                  bVar2 = std::operator==(psVar4,"TLS_CAINFO");
                  if (bVar2) {
                    psVar4 = psVar4 + 1;
                    local_1a8 = psVar4;
                    if (psVar4 == (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&helper,"UPLOAD missing file value for TLS_CAINFO.",
                                 (allocator<char> *)&local_220);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_001eceae;
                    }
                  }
                  else {
                    bVar2 = std::operator==(psVar4,"NETRC_FILE");
                    if (bVar2) {
                      psVar4 = psVar4 + 1;
                      if (psVar4 == (args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&helper,"UPLOAD missing file value for NETRC_FILE.",
                                   (allocator<char> *)&local_220);
                        std::__cxx11::string::_M_assign((string *)&status->Error);
                        goto LAB_001eceae;
                      }
                      std::__cxx11::string::_M_assign((string *)&netrc_file);
                    }
                    else {
                      bVar2 = std::operator==(psVar4,"NETRC");
                      if (bVar2) {
                        psVar4 = psVar4 + 1;
                        if (psVar4 == (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&helper,"UPLOAD missing level value for NETRC.",
                                     (allocator<char> *)&local_220);
                          std::__cxx11::string::_M_assign((string *)&status->Error);
                          goto LAB_001eceae;
                        }
                        std::__cxx11::string::_M_assign((string *)&netrc_level);
                      }
                      else {
                        bVar2 = std::operator==(psVar4,"USERPWD");
                        if (bVar2) {
                          psVar4 = psVar4 + 1;
                          if (psVar4 == (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&helper,"UPLOAD missing string for USERPWD.",
                                       (allocator<char> *)&local_220);
                            std::__cxx11::string::_M_assign((string *)&status->Error);
                            goto LAB_001eceae;
                          }
                          std::__cxx11::string::_M_assign((string *)&userpwd);
                        }
                        else {
                          bVar2 = std::operator==(psVar4,"HTTPHEADER");
                          if (bVar2) {
                            psVar4 = psVar4 + 1;
                            if (psVar4 == (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&helper,"UPLOAD missing string for HTTPHEADER.",
                                         (allocator<char> *)&local_220);
                              std::__cxx11::string::_M_assign((string *)&status->Error);
                              goto LAB_001eceae;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&curl_headers,psVar4);
                          }
                          else {
                            cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
                                      ((string *)&helper,(char (*) [22])"Unexpected argument: ",
                                       psVar4);
                            cmMakefile::IssueMessage
                                      (status->Makefile,AUTHOR_WARNING,(string *)&helper);
                            std::__cxx11::string::~string((string *)&helper);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (tls_version.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    pcVar1 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&helper,"CMAKE_TLS_VERSION",(allocator<char> *)&local_220);
    __u = cmMakefile::GetDefinition(pcVar1,(string *)&helper);
    std::__cxx11::string::~string((string *)&helper);
    if (__u.Value != (string *)0x0) {
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&tls_version,__u.Value);
    }
  }
  if (tls_version.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"CMAKE_TLS_VERSION",(allocator<char> *)&e_13);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&helper,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    if (helper.Text.field_2._M_local_buf[0] == '\x01') {
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&tls_version,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&helper);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&helper);
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&filename,"rb");
  if (__stream == (FILE *)0x0) {
    cmStrCat<char_const(&)[26],std::__cxx11::string&,char_const(&)[15]>
              ((string *)&helper,(char (*) [26])"UPLOAD cannot open file \'",&filename,
               (char (*) [15])"\' for reading.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001eceae:
    std::__cxx11::string::~string((string *)&helper);
  }
  else {
    uVar6 = cmsys::SystemTools::FileLength(&filename);
    std::__cxx11::string::string((string *)&local_50,(string *)&url);
    cmCurlFixFileURL((string *)&helper,&local_50);
    std::__cxx11::string::operator=((string *)&url,(string *)&helper);
    std::__cxx11::string::~string((string *)&helper);
    std::__cxx11::string::~string((string *)&local_50);
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      g_curl.Easy = data;
      CVar3 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar3 == CURLE_OK) {
        CVar3 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set upload flag: ",
                     (allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_URL,url._M_dataplus._M_p);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set url: ",(allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set write function: ",
                     (allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set debug function: ",
                     (allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
        if (tls_version.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          tls_version_00._M_str =
               (char *)tls_version.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_dataplus._M_p;
          tls_version_00._M_len =
               tls_version.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length;
          oVar7 = cmCurlParseTLSVersion(tls_version_00);
          if (((ulong)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
            cmStrCat<char_const(&)[38],std::__cxx11::string&>
                      ((string *)&helper,(char (*) [38])"UPLOAD given unknown TLS/SSL version ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tls_version);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            CVar3 = curl_easy_setopt(data,CURLOPT_SSLVERSION,
                                     (ulong)oVar7.super__Optional_base<int,_true,_true>._M_payload.
                                            super__Optional_payload_base<int> & 0xffffffff);
            if (CVar3 == CURLE_OK) goto LAB_001ed1d7;
            cmStrCat<char_const(&)[35],std::__cxx11::string&,char_const(&)[3]>
                      ((string *)&helper,(char (*) [35])"UPLOAD cannot set TLS/SSL version ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tls_version,(char (*) [3])0x6894f9);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&helper);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          goto LAB_001ecfe4;
        }
LAB_001ed1d7:
        if (local_241 == false) {
          CVar3 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar3 == CURLE_OK) goto LAB_001ed281;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set TLS/SSL Verify off: ",
                     (allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
        CVar3 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar3 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set TLS/SSL Verify on: ",
                     (allocator<char> *)&local_220);
          curl_easy_strerror(CVar3);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001ecfe4;
        }
LAB_001ed281:
        if (local_1a8 == (string *)0x0) {
          local_1a8 = &cmValue::Empty_abi_cxx11_;
        }
        cmCurlSetCAInfo(&local_220,data,local_1a8);
        if (local_220._M_string_length == 0) {
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          CVar3 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
          if (CVar3 == CURLE_OK) {
            CVar3 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
            if (CVar3 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set debug data: ",(allocator<char> *)&e_13
                        );
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001ed424;
            }
            CVar3 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar3 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set follow-redirect option: ",
                         (allocator<char> *)&e_13);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001ed424;
            }
            if ((logVar._M_string_length != 0) &&
               (CVar3 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar3 != CURLE_OK)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set verbose: ",(allocator<char> *)&e_13);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001ed424;
            }
            if ((0 < lVar5) &&
               (CVar3 = curl_easy_setopt(data,CURLOPT_TIMEOUT,lVar5), CVar3 != CURLE_OK)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set timeout: ",(allocator<char> *)&e_13);
              curl_easy_strerror(CVar3);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001ed424;
            }
            if (0 < (long)local_200) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,local_200);
            }
            cURLProgressHelper::cURLProgressHelper(&helper,status->Makefile,"upload");
            if (bVar9) {
              CVar3 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar3 == CURLE_OK) {
                CVar3 = curl_easy_setopt(data,CURLOPT_XFERINFOFUNCTION,cmFileUploadProgressCallback)
                ;
                if (CVar3 == CURLE_OK) {
                  CVar3 = curl_easy_setopt(data,CURLOPT_XFERINFODATA,&helper);
                  if (CVar3 == CURLE_OK) goto LAB_001ed663;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e_13,"UPLOAD cannot set progress data: ",
                             (allocator<char> *)&log);
                  curl_easy_strerror(CVar3);
                  std::__cxx11::string::append((char *)&e_13);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e_13,"UPLOAD cannot set progress function: ",
                             (allocator<char> *)&log);
                  curl_easy_strerror(CVar3);
                  std::__cxx11::string::append((char *)&e_13);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_13,"UPLOAD cannot set noprogress value: ",
                           (allocator<char> *)&log);
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&e_13);
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
LAB_001ed70f:
              std::__cxx11::string::~string((string *)&e_13);
              bVar9 = false;
            }
            else {
LAB_001ed663:
              CVar3 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
              if (CVar3 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_13,"UPLOAD cannot set input file: ",(allocator<char> *)&log)
                ;
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&e_13);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001ed70f;
              }
              CVar3 = curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar6);
              if (CVar3 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_13,"UPLOAD cannot set input file size: ",
                           (allocator<char> *)&log);
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&e_13);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001ed70f;
              }
              if ((userpwd._M_string_length != 0) &&
                 (CVar3 = curl_easy_setopt(data,CURLOPT_USERPWD,userpwd._M_dataplus._M_p),
                 CVar3 != CURLE_OK)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_13,"UPLOAD cannot set user password: ",
                           (allocator<char> *)&log);
                curl_easy_strerror(CVar3);
                std::__cxx11::string::append((char *)&e_13);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001ed70f;
              }
              cmsys::SystemTools::UpperCase(&e_13,&netrc_level);
              std::__cxx11::string::operator=((string *)&netrc_level,(string *)&e_13);
              std::__cxx11::string::~string((string *)&e_13);
              cmCurlSetNETRCOption(&e_13,data,&netrc_level,&netrc_file);
              bVar9 = e_13._M_string_length == 0;
              if (bVar9) {
                local_200 = curl_headers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                list = (curl_slist *)0x0;
                for (pbVar8 = curl_headers.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar8 != local_200;
                    pbVar8 = pbVar8 + 1) {
                  list = curl_slist_append(list,(pbVar8->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar3 = curl_easy_perform(data);
                curl_slist_free_all(list);
                g_curl.Easy = (CURL *)0x0;
                curl_easy_cleanup((Curl_easy *)helper.CurrentPercentage);
                if (statusVar._M_string_length != 0) {
                  pcVar1 = status->Makefile;
                  local_1cc = CVar3;
                  local_198 = curl_easy_strerror(CVar3);
                  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>
                            (&log,(int *)&local_1cc,(char (*) [3])0x6ba9b5,&local_198,
                             (char (*) [2])0x6a2b8e);
                  value_00._M_str = log._M_dataplus._M_p;
                  value_00._M_len = log._M_string_length;
                  cmMakefile::AddDefinition(pcVar1,&statusVar,value_00);
                  std::__cxx11::string::~string((string *)&log);
                }
                curl_global_cleanup();
                fclose(__stream);
                if (logVar._M_string_length != 0) {
                  log._M_dataplus._M_p = (pointer)&log.field_2;
                  log._M_string_length = 0;
                  log.field_2._M_local_buf[0] = '\0';
                  if (chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_198 = (char *)((ulong)local_198 & 0xffffffffffffff00);
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&chunkResponse,(char *)&local_198);
                    std::__cxx11::string::append((char *)&log);
                    std::__cxx11::string::append((char *)&log);
                    std::__cxx11::string::append((char *)&log);
                  }
                  if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_198 = (char *)((ulong)local_198 & 0xffffffffffffff00);
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&chunkDebug,(char *)&local_198);
                    std::__cxx11::string::append((char *)&log);
                    std::__cxx11::string::append((char *)&log);
                    std::__cxx11::string::append((char *)&log);
                  }
                  value_01._M_str = log._M_dataplus._M_p;
                  value_01._M_len = log._M_string_length;
                  cmMakefile::AddDefinition(status->Makefile,&logVar,value_01);
                  std::__cxx11::string::~string((string *)&log);
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              std::__cxx11::string::~string((string *)&e_13);
            }
            std::__cxx11::string::~string((string *)&helper.Text);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&helper,"UPLOAD cannot set write data: ",(allocator<char> *)&e_13);
            curl_easy_strerror(CVar3);
            std::__cxx11::string::append((char *)&helper);
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001ed424:
            std::__cxx11::string::~string((string *)&helper);
            bVar9 = false;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&chunkResponse.super__Vector_base<char,_std::allocator<char>_>);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&status->Error);
          bVar9 = false;
        }
        std::__cxx11::string::~string((string *)&local_220);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&helper,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)&local_220);
        curl_easy_strerror(CVar3);
        std::__cxx11::string::append((char *)&helper);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001ecfe4:
        std::__cxx11::string::~string((string *)&helper);
        bVar9 = false;
      }
      cURLEasyGuard::~cURLEasyGuard(&g_curl);
      goto LAB_001ecffb;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&helper,"UPLOAD error initializing curl.",(allocator<char> *)&local_220);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&helper);
    fclose(__stream);
  }
  bVar9 = false;
LAB_001ecffb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&curl_headers);
  std::__cxx11::string::~string((string *)&netrc_file);
  std::__cxx11::string::~string((string *)&netrc_level);
  std::__cxx11::string::~string((string *)&userpwd);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tls_version);
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&filename);
  return bVar9;
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  cm::optional<std::string> tls_version;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERSION") {
      ++i;
      if (i != args.end()) {
        tls_version = *i;
      } else {
        status.SetError("UPLOAD missing value for TLS_VERSION.");
        return false;
      }
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  if (!tls_version) {
    if (cmValue v = status.GetMakefile().GetDefinition("CMAKE_TLS_VERSION")) {
      tls_version = *v;
    }
  }
  if (!tls_version) {
    if (cm::optional<std::string> v =
          cmSystemTools::GetEnvVar("CMAKE_TLS_VERSION")) {
      tls_version = std::move(v);
    }
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  if (tls_version) {
    if (cm::optional<int> v = cmCurlParseTLSVersion(*tls_version)) {
      res = ::curl_easy_setopt(curl, CURLOPT_SSLVERSION, *v);
      check_curl_result(
        res,
        cmStrCat("UPLOAD cannot set TLS/SSL version ", *tls_version, ": "));
    } else {
      status.SetError(
        cmStrCat("UPLOAD given unknown TLS/SSL version ", *tls_version));
      return false;
    }
  }

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CM_CURLOPT_XFERINFOFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}